

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInputUBO2
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  reference pvVar2;
  int *ip_1;
  float *fp_1;
  int local_28;
  int i_2;
  int i_1;
  int i;
  int *ip;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x460);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '@';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '@';
  pvVar1[0xb] = '@';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = 0x80;
  pvVar1[0xf] = '@';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = 0xa0;
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = 0xc0;
  pvVar1[0x17] = '@';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = 0xe0;
  pvVar1[0x1b] = '@';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\0';
  pvVar1[0x23] = 'A';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\x10';
  pvVar1[0x23] = 'A';
  pvVar1[0x30] = '\0';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = ' ';
  pvVar1[0x33] = 'A';
  pvVar1[0x40] = '\0';
  pvVar1[0x41] = '\0';
  pvVar1[0x42] = '0';
  pvVar1[0x43] = 'A';
  pvVar1[0x50] = '\0';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = '@';
  pvVar1[0x53] = 'A';
  pvVar1[0x60] = '\0';
  pvVar1[0x61] = '\0';
  pvVar1[0x62] = 'P';
  pvVar1[99] = 'A';
  pvVar2[0x70] = '\x0e';
  pvVar2[0x71] = '\0';
  pvVar2[0x72] = '\0';
  pvVar2[0x73] = '\0';
  for (i_2 = 0; i_2 < 0x14; i_2 = i_2 + 1) {
    *(float *)(pvVar1 + (long)(i_2 * 4 + 0x20) * 4) = (float)(i_2 + 0xf);
  }
  pvVar2[0x1c0] = 0x8c;
  pvVar2[0x1c1] = '\0';
  pvVar2[0x1c2] = '\0';
  pvVar2[0x1c3] = '\0';
  for (local_28 = 0; local_28 < 0x14; local_28 = local_28 + 1) {
    *(float *)(pvVar1 + (long)(local_28 * 4 + 0x74) * 4) = (float)(local_28 + 0x96);
  }
  pvVar2[0x310] = 'x';
  pvVar2[0x311] = '\x05';
  pvVar2[0x312] = '\0';
  pvVar2[0x313] = '\0';
  for (fp_1._4_4_ = 0; fp_1._4_4_ < 0x14; fp_1._4_4_ = fp_1._4_4_ + 1) {
    *(float *)(pvVar1 + (long)(fp_1._4_4_ * 4 + 200) * 4) = (float)(fp_1._4_4_ + 0x5dc);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + 1,0x130);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 1,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data + 1,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '@';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '@';
  pvVar1[0xb] = '@';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = 0x80;
  pvVar1[0xf] = '@';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = 0xa0;
  pvVar1[0x13] = '@';
  pvVar1[0x14] = '\0';
  pvVar1[0x15] = '\0';
  pvVar1[0x16] = 0xc0;
  pvVar1[0x17] = '@';
  pvVar1[0x18] = '\0';
  pvVar1[0x19] = '\0';
  pvVar1[0x1a] = 0xe0;
  pvVar1[0x1b] = '@';
  pvVar1[0x1c] = '\0';
  pvVar1[0x1d] = '\0';
  pvVar1[0x1e] = '\0';
  pvVar1[0x1f] = 'A';
  pvVar1[0x20] = '\0';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\x10';
  pvVar1[0x23] = 'A';
  pvVar1[0x24] = '\0';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = ' ';
  pvVar1[0x27] = 'A';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '0';
  pvVar1[0x2b] = 'A';
  pvVar1[0x2c] = '\0';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '@';
  pvVar1[0x2f] = 'A';
  pvVar1[0x30] = '\0';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = 'P';
  pvVar1[0x33] = 'A';
  pvVar2[0x34] = '\x0e';
  pvVar2[0x35] = '\0';
  pvVar2[0x36] = '\0';
  pvVar2[0x37] = '\0';
  pvVar1[0x38] = '\0';
  pvVar1[0x39] = '\0';
  pvVar1[0x3a] = 'p';
  pvVar1[0x3b] = 'A';
  pvVar1[0x3c] = '\0';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = 0x80;
  pvVar1[0x3f] = 'A';
  pvVar1[0x40] = '\0';
  pvVar1[0x41] = '\0';
  pvVar1[0x42] = 0x88;
  pvVar1[0x43] = 'A';
  pvVar1[0x44] = '\0';
  pvVar1[0x45] = '\0';
  pvVar1[0x46] = 0x90;
  pvVar1[0x47] = 'A';
  pvVar1[0x48] = '\0';
  pvVar1[0x49] = '\0';
  pvVar1[0x4a] = 0x98;
  pvVar1[0x4b] = 'A';
  pvVar1[0x4c] = '\0';
  pvVar1[0x4d] = '\0';
  pvVar1[0x4e] = 0xa0;
  pvVar1[0x4f] = 'A';
  pvVar1[0x50] = '\0';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = 0xa8;
  pvVar1[0x53] = 'A';
  pvVar1[0x54] = '\0';
  pvVar1[0x55] = '\0';
  pvVar1[0x56] = 0xb0;
  pvVar1[0x57] = 'A';
  pvVar1[0x58] = '\0';
  pvVar1[0x59] = '\0';
  pvVar1[0x5a] = 0xb8;
  pvVar1[0x5b] = 'A';
  pvVar1[0x5c] = '\0';
  pvVar1[0x5d] = '\0';
  pvVar1[0x5e] = 0xc0;
  pvVar1[0x5f] = 'A';
  pvVar1[0x60] = '\0';
  pvVar1[0x61] = '\0';
  pvVar1[0x62] = 200;
  pvVar1[99] = 'A';
  pvVar1[100] = '\0';
  pvVar1[0x65] = '\0';
  pvVar1[0x66] = 0xd0;
  pvVar1[0x67] = 'A';
  pvVar1[0x68] = '\0';
  pvVar1[0x69] = '\0';
  pvVar1[0x6a] = 0xd8;
  pvVar1[0x6b] = 'A';
  pvVar1[0x6c] = '\0';
  pvVar1[0x6d] = '\0';
  pvVar1[0x6e] = 0xe0;
  pvVar1[0x6f] = 'A';
  pvVar1[0x70] = '\0';
  pvVar1[0x71] = '\0';
  pvVar1[0x72] = 0xe8;
  pvVar1[0x73] = 'A';
  pvVar1[0x74] = '\0';
  pvVar1[0x75] = '\0';
  pvVar1[0x76] = 0xf0;
  pvVar1[0x77] = 'A';
  pvVar1[0x78] = '\0';
  pvVar1[0x79] = '\0';
  pvVar1[0x7a] = 0xf8;
  pvVar1[0x7b] = 'A';
  pvVar1[0x7c] = '\0';
  pvVar1[0x7d] = '\0';
  pvVar1[0x7e] = '\0';
  pvVar1[0x7f] = 'B';
  pvVar1[0x80] = '\0';
  pvVar1[0x81] = '\0';
  pvVar1[0x82] = '\x04';
  pvVar1[0x83] = 'B';
  pvVar1[0x84] = '\0';
  pvVar1[0x85] = '\0';
  pvVar1[0x86] = '\b';
  pvVar1[0x87] = 'B';
  pvVar2[0x88] = '#';
  pvVar2[0x89] = '\0';
  pvVar2[0x8a] = '\0';
  pvVar2[0x8b] = '\0';
  pvVar1[0x8c] = '\0';
  pvVar1[0x8d] = '\0';
  pvVar1[0x8e] = '\x10';
  pvVar1[0x8f] = 'B';
  pvVar1[0x90] = '\0';
  pvVar1[0x91] = '\0';
  pvVar1[0x92] = '\x14';
  pvVar1[0x93] = 'B';
  pvVar1[0x94] = '\0';
  pvVar1[0x95] = '\0';
  pvVar1[0x96] = '\x18';
  pvVar1[0x97] = 'B';
  pvVar1[0x98] = '\0';
  pvVar1[0x99] = '\0';
  pvVar1[0x9a] = '\x1c';
  pvVar1[0x9b] = 'B';
  pvVar1[0x9c] = '\0';
  pvVar1[0x9d] = '\0';
  pvVar1[0x9e] = ' ';
  pvVar1[0x9f] = 'B';
  pvVar1[0xa0] = '\0';
  pvVar1[0xa1] = '\0';
  pvVar1[0xa2] = '$';
  pvVar1[0xa3] = 'B';
  pvVar1[0xa4] = '\0';
  pvVar1[0xa5] = '\0';
  pvVar1[0xa6] = '(';
  pvVar1[0xa7] = 'B';
  pvVar1[0xa8] = '\0';
  pvVar1[0xa9] = '\0';
  pvVar1[0xaa] = ',';
  pvVar1[0xab] = 'B';
  pvVar1[0xac] = '\0';
  pvVar1[0xad] = '\0';
  pvVar1[0xae] = '0';
  pvVar1[0xaf] = 'B';
  pvVar1[0xb0] = '\0';
  pvVar1[0xb1] = '\0';
  pvVar1[0xb2] = '4';
  pvVar1[0xb3] = 'B';
  pvVar1[0xb4] = '\0';
  pvVar1[0xb5] = '\0';
  pvVar1[0xb6] = '8';
  pvVar1[0xb7] = 'B';
  pvVar1[0xb8] = '\0';
  pvVar1[0xb9] = '\0';
  pvVar1[0xba] = '<';
  pvVar1[0xbb] = 'B';
  pvVar1[0xbc] = '\0';
  pvVar1[0xbd] = '\0';
  pvVar1[0xbe] = '@';
  pvVar1[0xbf] = 'B';
  pvVar1[0xc0] = '\0';
  pvVar1[0xc1] = '\0';
  pvVar1[0xc2] = 'D';
  pvVar1[0xc3] = 'B';
  pvVar1[0xc4] = '\0';
  pvVar1[0xc5] = '\0';
  pvVar1[0xc6] = 'H';
  pvVar1[199] = 'B';
  pvVar1[200] = '\0';
  pvVar1[0xc9] = '\0';
  pvVar1[0xca] = 'L';
  pvVar1[0xcb] = 'B';
  pvVar1[0xcc] = '\0';
  pvVar1[0xcd] = '\0';
  pvVar1[0xce] = 'P';
  pvVar1[0xcf] = 'B';
  pvVar1[0xd0] = '\0';
  pvVar1[0xd1] = '\0';
  pvVar1[0xd2] = 'T';
  pvVar1[0xd3] = 'B';
  pvVar1[0xd4] = '\0';
  pvVar1[0xd5] = '\0';
  pvVar1[0xd6] = 'X';
  pvVar1[0xd7] = 'B';
  pvVar1[0xd8] = '\0';
  pvVar1[0xd9] = '\0';
  pvVar1[0xda] = '\\';
  pvVar1[0xdb] = 'B';
  pvVar2[0xdc] = '8';
  pvVar2[0xdd] = '\0';
  pvVar2[0xde] = '\0';
  pvVar2[0xdf] = '\0';
  pvVar1[0xe0] = '\0';
  pvVar1[0xe1] = '\0';
  pvVar1[0xe2] = 'd';
  pvVar1[0xe3] = 'B';
  pvVar1[0xe4] = '\0';
  pvVar1[0xe5] = '\0';
  pvVar1[0xe6] = 'h';
  pvVar1[0xe7] = 'B';
  pvVar1[0xe8] = '\0';
  pvVar1[0xe9] = '\0';
  pvVar1[0xea] = 'l';
  pvVar1[0xeb] = 'B';
  pvVar1[0xec] = '\0';
  pvVar1[0xed] = '\0';
  pvVar1[0xee] = 'p';
  pvVar1[0xef] = 'B';
  pvVar1[0xf0] = '\0';
  pvVar1[0xf1] = '\0';
  pvVar1[0xf2] = 't';
  pvVar1[0xf3] = 'B';
  pvVar1[0xf4] = '\0';
  pvVar1[0xf5] = '\0';
  pvVar1[0xf6] = 'x';
  pvVar1[0xf7] = 'B';
  pvVar1[0xf8] = '\0';
  pvVar1[0xf9] = '\0';
  pvVar1[0xfa] = '|';
  pvVar1[0xfb] = 'B';
  pvVar1[0xfc] = '\0';
  pvVar1[0xfd] = '\0';
  pvVar1[0xfe] = 0x80;
  pvVar1[0xff] = 'B';
  pvVar1[0x100] = '\0';
  pvVar1[0x101] = '\0';
  pvVar1[0x102] = 0x82;
  pvVar1[0x103] = 'B';
  pvVar1[0x104] = '\0';
  pvVar1[0x105] = '\0';
  pvVar1[0x106] = 0x84;
  pvVar1[0x107] = 'B';
  pvVar1[0x108] = '\0';
  pvVar1[0x109] = '\0';
  pvVar1[0x10a] = 0x86;
  pvVar1[0x10b] = 'B';
  pvVar1[0x10c] = '\0';
  pvVar1[0x10d] = '\0';
  pvVar1[0x10e] = 0x88;
  pvVar1[0x10f] = 'B';
  pvVar1[0x110] = '\0';
  pvVar1[0x111] = '\0';
  pvVar1[0x112] = 0x8a;
  pvVar1[0x113] = 'B';
  pvVar1[0x114] = '\0';
  pvVar1[0x115] = '\0';
  pvVar1[0x116] = 0x8c;
  pvVar1[0x117] = 'B';
  pvVar1[0x118] = '\0';
  pvVar1[0x119] = '\0';
  pvVar1[0x11a] = 0x8e;
  pvVar1[0x11b] = 'B';
  pvVar1[0x11c] = '\0';
  pvVar1[0x11d] = '\0';
  pvVar1[0x11e] = 0x90;
  pvVar1[0x11f] = 'B';
  pvVar1[0x120] = '\0';
  pvVar1[0x121] = '\0';
  pvVar1[0x122] = 0x92;
  pvVar1[0x123] = 'B';
  pvVar1[0x124] = '\0';
  pvVar1[0x125] = '\0';
  pvVar1[0x126] = 0x94;
  pvVar1[0x127] = 'B';
  pvVar1[0x128] = '\0';
  pvVar1[0x129] = '\0';
  pvVar1[0x12a] = 0x96;
  pvVar1[299] = 'B';
  pvVar1[300] = '\0';
  pvVar1[0x12d] = '\0';
  pvVar1[0x12e] = 0x98;
  pvVar1[0x12f] = 'B';
  return 
  "\nstruct MM {\n  float mm_a[5];\n};\nstruct TT {\n  int tt_a;\n  MM  tt_b[4];\n};\nlayout(std140, binding = 0) uniform InputUBO {\n  vec4  a;\n  vec4  b;\n  float c;\n  float d[4];\n  TT    e[3];\n} g_input_ubo;\nlayout(std430, binding = 0) buffer InputSSBO {\n  vec4  a;\n  vec4  b;\n  float c;\n  float d[4];\n  TT    e[3];\n} g_input_ssbo;\nlayout(std140, binding = 1) buffer OutputUBO {\n  vec4  a;\n  vec4  b;\n  float c;\n  float d[4];\n  TT    e[3];\n} g_output_ubo;\nlayout(std430, binding = 2) buffer OutputSSBO {\n  vec4  a;\n  vec4  b;\n  float c;\n  float d[4];\n  TT    e[3];\n} g_output_ssbo;\nuniform int g_index1 = 1;\nvoid main() {\n  int index0 = 0;\n\n  g_output_ubo.a = g_input_ubo.a;\n  g_output_ubo.b = g_input_ubo.b;\n  g_output_ubo.c = g_input_ubo.c;\n  for (int i = 0; i < g_input_ubo.d.length(); ++i) g_output_ubo.d[i] = g_input_ubo.d[i];\n    for (int j = 0; j < g_input_ubo.e.length(); ++j) {\n    g_output_ubo.e[j].tt_a = g_input_ubo.e[j].tt_a;\n    for (int i = 0; i < g_input_ubo.e[j].tt_b.length(); ++i) {\n      g_output_ubo.e[j].tt_b[i].mm_a[0] = g_input_ubo.e[j].tt_b[i].mm_a[0];\n      g_output_ubo.e[j].tt_b[index0 + i].mm_a[1] = g_input_ubo.e[j].tt_b[i].mm_a[1];\n      g_output_ubo.e[j].tt_b[i].mm_a[2] = g_input_ubo.e[j].tt_b[i].mm_a[2 + index0];\n      g_output_ubo.e[j + 1 - g_index1].tt_b[i].mm_a[4 - g_index1] = g_input_ubo.e[j].tt_b[i].mm_a[2 + g_index1];\n      g_output_ubo.e[j].tt_b[i].mm_a[4] = g_input_ubo.e[j].tt_b[i - index0].mm_a[4];\n    }\n  }\n\n  g_output_ssbo.a = g_input_ssbo.a;\n  g_output_ssbo.b = g_input_ssbo.b;\n  g_output_ssbo.c = g_input_ssbo.c;\n  for (int i = 0; i < g_input_ssbo.d.length(); ++i) g_output_ssbo.d[i] = g_input_ssbo.d[i];\n  for (int j = 0; j < g_input_ssbo.e.length(); ++j) {\n    g_output_ssbo.e[j].tt_a = g_input_ssbo.e[j].tt_a;\n    for (int i = 0; i < g_input_ssbo.e[j].tt_b.length(); ++i) {\n      g_output_ssbo.e[j + index0].tt_b[i].mm_a[0] = g_input_ssbo.e[j].tt_b[i].mm_a[index0];\n      g_output_ssbo.e[j].tt_b[i + index0].mm_a[1] = g_input_ssbo.e[j].tt_b[i].mm_a[g_index1];\n      g_output_ssbo.e[j].tt_b[i].mm_a[2] = ..." /* TRUNCATED STRING LITERAL */
  ;
}

Assistant:

const char* GetInputUBO2(std::vector<GLubyte> in_data[2])
{
	/* UBO */
	{
		in_data[0].resize(280 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[0][0]);
		int*   ip = reinterpret_cast<int*>(&in_data[0][0]);
		fp[0]	 = 1.0f;
		fp[1]	 = 2.0f;
		fp[2]	 = 3.0f;
		fp[3]	 = 4.0f;
		fp[4]	 = 5.0f;
		fp[5]	 = 6.0f;
		fp[6]	 = 7.0f;
		fp[8]	 = 8.0f;
		fp[8]	 = 9.0f;
		fp[12]	= 10.0f;
		fp[16]	= 11.0f;
		fp[20]	= 12.0f;
		fp[24]	= 13.0f;

		ip[28] = 14;
		for (int i = 0; i < 20; ++i)
		{
			fp[32 + i * 4] = static_cast<float>(15 + i);
		}
		ip[112] = 140;
		for (int i = 0; i < 20; ++i)
		{
			fp[116 + i * 4] = static_cast<float>(150 + i);
		}
		ip[196] = 1400;
		for (int i = 0; i < 20; ++i)
		{
			fp[200 + i * 4] = static_cast<float>(1500 + i);
		}
	}
	/* SSBO */
	{
		in_data[1].resize(76 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[1][0]);
		int*   ip = reinterpret_cast<int*>(&in_data[1][0]);
		fp[0]	 = 1.0f;
		fp[1]	 = 2.0f;
		fp[2]	 = 3.0f;
		fp[3]	 = 4.0f;
		fp[4]	 = 5.0f;
		fp[5]	 = 6.0f;
		fp[6]	 = 7.0f;
		fp[7]	 = 8.0f;
		fp[8]	 = 9.0f;
		fp[9]	 = 10.0f;
		fp[10]	= 11.0f;
		fp[11]	= 12.0f;
		fp[12]	= 13.0f;
		ip[13]	= 14;
		fp[14]	= 15.0f;
		fp[15]	= 16.0f;
		fp[16]	= 17.0f;
		fp[17]	= 18.0f;
		fp[18]	= 19.0f;
		fp[19]	= 20.0f;
		fp[20]	= 21.0f;
		fp[21]	= 22.0f;
		fp[22]	= 23.0f;
		fp[23]	= 24.0f;
		fp[24]	= 25.0f;
		fp[25]	= 26.0f;
		fp[26]	= 27.0f;
		fp[27]	= 28.0f;
		fp[28]	= 29.0f;
		fp[29]	= 30.0f;
		fp[30]	= 31.0f;
		fp[31]	= 32.0f;
		fp[32]	= 33.0f;
		fp[33]	= 34.0f;
		ip[34]	= 35;
		fp[35]	= 36.0f;
		fp[36]	= 37.0f;
		fp[37]	= 38.0f;
		fp[38]	= 39.0f;
		fp[39]	= 40.0f;
		fp[40]	= 41.0f;
		fp[41]	= 42.0f;
		fp[42]	= 43.0f;
		fp[43]	= 44.0f;
		fp[44]	= 45.0f;
		fp[45]	= 46.0f;
		fp[46]	= 47.0f;
		fp[47]	= 48.0f;
		fp[48]	= 49.0f;
		fp[49]	= 50.0f;
		fp[50]	= 51.0f;
		fp[51]	= 52.0f;
		fp[52]	= 53.0f;
		fp[53]	= 54.0f;
		fp[54]	= 55.0f;
		ip[55]	= 56;
		fp[56]	= 57.0f;
		fp[57]	= 58.0f;
		fp[58]	= 59.0f;
		fp[59]	= 60.0f;
		fp[60]	= 61.0f;
		fp[61]	= 62.0f;
		fp[62]	= 63.0f;
		fp[63]	= 64.0f;
		fp[64]	= 65.0f;
		fp[65]	= 66.0f;
		fp[66]	= 67.0f;
		fp[67]	= 68.0f;
		fp[68]	= 69.0f;
		fp[69]	= 70.0f;
		fp[70]	= 71.0f;
		fp[71]	= 72.0f;
		fp[72]	= 73.0f;
		fp[73]	= 74.0f;
		fp[74]	= 75.0f;
		fp[75]	= 76.0f;
	}
	return NL
		"struct MM {" NL "  float mm_a[5];" NL "};" NL "struct TT {" NL "  int tt_a;" NL "  MM  tt_b[4];" NL "};" NL
		"layout(std140, binding = 0) uniform InputUBO {" NL "  vec4  a;" NL "  vec4  b;" NL "  float c;" NL
		"  float d[4];" NL "  TT    e[3];" NL "} g_input_ubo;" NL "layout(std430, binding = 0) buffer InputSSBO {" NL
		"  vec4  a;" NL "  vec4  b;" NL "  float c;" NL "  float d[4];" NL "  TT    e[3];" NL "} g_input_ssbo;" NL
		"layout(std140, binding = 1) buffer OutputUBO {" NL "  vec4  a;" NL "  vec4  b;" NL "  float c;" NL
		"  float d[4];" NL "  TT    e[3];" NL "} g_output_ubo;" NL "layout(std430, binding = 2) buffer OutputSSBO {" NL
		"  vec4  a;" NL "  vec4  b;" NL "  float c;" NL "  float d[4];" NL "  TT    e[3];" NL "} g_output_ssbo;" NL
		"uniform int g_index1 = 1;" NL "void main() {" NL "  int index0 = 0;" NL NL
		"  g_output_ubo.a = g_input_ubo.a;" NL "  g_output_ubo.b = g_input_ubo.b;" NL
		"  g_output_ubo.c = g_input_ubo.c;" NL
		"  for (int i = 0; i < g_input_ubo.d.length(); ++i) g_output_ubo.d[i] = g_input_ubo.d[i];" NL
		"    for (int j = 0; j < g_input_ubo.e.length(); ++j) {" NL
		"    g_output_ubo.e[j].tt_a = g_input_ubo.e[j].tt_a;" NL
		"    for (int i = 0; i < g_input_ubo.e[j].tt_b.length(); ++i) {" NL
		"      g_output_ubo.e[j].tt_b[i].mm_a[0] = g_input_ubo.e[j].tt_b[i].mm_a[0];" NL
		"      g_output_ubo.e[j].tt_b[index0 + i].mm_a[1] = g_input_ubo.e[j].tt_b[i].mm_a[1];" NL
		"      g_output_ubo.e[j].tt_b[i].mm_a[2] = g_input_ubo.e[j].tt_b[i].mm_a[2 + index0];" NL
		"      g_output_ubo.e[j + 1 - g_index1].tt_b[i].mm_a[4 - g_index1] = g_input_ubo.e[j].tt_b[i].mm_a[2 + "
		"g_index1];" NL "      g_output_ubo.e[j].tt_b[i].mm_a[4] = g_input_ubo.e[j].tt_b[i - index0].mm_a[4];" NL
		"    }" NL "  }" NL NL "  g_output_ssbo.a = g_input_ssbo.a;" NL "  g_output_ssbo.b = g_input_ssbo.b;" NL
		"  g_output_ssbo.c = g_input_ssbo.c;" NL
		"  for (int i = 0; i < g_input_ssbo.d.length(); ++i) g_output_ssbo.d[i] = g_input_ssbo.d[i];" NL
		"  for (int j = 0; j < g_input_ssbo.e.length(); ++j) {" NL
		"    g_output_ssbo.e[j].tt_a = g_input_ssbo.e[j].tt_a;" NL
		"    for (int i = 0; i < g_input_ssbo.e[j].tt_b.length(); ++i) {" NL
		"      g_output_ssbo.e[j + index0].tt_b[i].mm_a[0] = g_input_ssbo.e[j].tt_b[i].mm_a[index0];" NL
		"      g_output_ssbo.e[j].tt_b[i + index0].mm_a[1] = g_input_ssbo.e[j].tt_b[i].mm_a[g_index1];" NL
		"      g_output_ssbo.e[j].tt_b[i].mm_a[2] = g_input_ssbo.e[j].tt_b[i].mm_a[1 + g_index1];" NL
		"      g_output_ssbo.e[j - index0].tt_b[i].mm_a[g_index1 + 2] = g_input_ssbo.e[j].tt_b[i].mm_a[4 - "
		"g_index1];" NL "      g_output_ssbo.e[j].tt_b[i].mm_a[4] = g_input_ssbo.e[j].tt_b[i].mm_a[4];" NL "    }" NL
		"  }" NL "}";
}